

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix.c++
# Opt level: O0

void __thiscall
kj::UnixEventPort::updateNextTimerEvent
          (UnixEventPort *this,
          Maybe<kj::Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel>_> *time)

{
  bool bVar1;
  int iVar2;
  OwnFd *pOVar3;
  Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel> *this_00;
  void *pvVar4;
  Fault local_f8;
  Fault f_3;
  SyscallResult local_dc;
  Quantity<long,_kj::_::NanosecondLabel> QStack_d8;
  SyscallResult _kjSyscallResult_2;
  Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel> local_d0;
  Quantity<long,_kj::_::NanosecondLabel> local_c8;
  Quantity<long,_kj::_::NanosecondLabel> t2;
  Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel> *t;
  Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel> *_t793;
  itimerspec ts;
  Fault f_2;
  SyscallResult local_6c;
  undefined4 local_68;
  SyscallResult _kjSyscallResult_1;
  epoll_event event;
  Fault local_50;
  Fault f_1;
  SyscallResult local_3c;
  undefined1 local_38 [4];
  SyscallResult _kjSyscallResult;
  int _kj_fd;
  OwnFd *f;
  OwnFd *_f777;
  int tfd;
  Maybe<kj::Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel>_> *time_local;
  UnixEventPort *this_local;
  
  _tfd = time;
  time_local = (Maybe<kj::Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel>_> *
               )this;
  bVar1 = Maybe<kj::Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel>_>::
          operator==();
  if ((!bVar1) || ((this->timerfdIsArmed & 1U) != 0)) {
    pOVar3 = kj::_::readMaybe<kj::OwnFd>(&this->timerFd);
    if (pOVar3 == (OwnFd *)0x0) {
      f_1.exception = (Exception *)local_38;
      local_3c = kj::_::Debug::
                 syscall<kj::UnixEventPort::updateNextTimerEvent(kj::Maybe<kj::Absolute<kj::Quantity<long,kj::_::NanosecondLabel>,kj::_::TimeLabel>>)::__0>
                           ((anon_class_8_1_4955c7dd *)&f_1,false);
      pvVar4 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_3c);
      if (pvVar4 == (void *)0x0) {
        iVar2 = kj::_::Debug::SyscallResult::getErrorNumber(&local_3c);
        kj::_::Debug::Fault::Fault
                  (&local_50,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
                   ,0x30d,iVar2,"_kj_fd = timerfd_create(1, TFD_CLOEXEC | TFD_NONBLOCK)","");
        kj::_::Debug::Fault::fatal(&local_50);
      }
      OwnFd::OwnFd((OwnFd *)&_kjSyscallResult,(int)local_38);
      pOVar3 = Maybe<kj::OwnFd>::emplace<kj::OwnFd>(&this->timerFd,(OwnFd *)&_kjSyscallResult);
      _f777._0_4_ = OwnFd::operator_cast_to_int(pOVar3);
      OwnFd::~OwnFd((OwnFd *)&_kjSyscallResult);
      memset(&local_68,0,0xc);
      local_68 = 1;
      __kjSyscallResult_1 = 1;
      f_2.exception = (Exception *)this;
      local_6c = kj::_::Debug::
                 syscall<kj::UnixEventPort::updateNextTimerEvent(kj::Maybe<kj::Absolute<kj::Quantity<long,kj::_::NanosecondLabel>,kj::_::TimeLabel>>)::__1>
                           ((anon_class_24_3_13fbcafb *)&f_2,false);
      pvVar4 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_6c);
      if (pvVar4 == (void *)0x0) {
        iVar2 = kj::_::Debug::SyscallResult::getErrorNumber(&local_6c);
        kj::_::Debug::Fault::Fault
                  ((Fault *)&ts.it_value.tv_nsec,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
                   ,0x313,iVar2,"epoll_ctl(epollFd, EPOLL_CTL_ADD, tfd, &event)","");
        kj::_::Debug::Fault::fatal((Fault *)&ts.it_value.tv_nsec);
      }
    }
    else {
      _f777._0_4_ = OwnFd::operator_cast_to_int(pOVar3);
    }
    memset(&_t793,0,0x20);
    this_00 = kj::_::
              readMaybe<kj::Absolute<kj::Quantity<long,kj::_::NanosecondLabel>,kj::_::TimeLabel>>
                        (time);
    if (this_00 == (Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel> *)0x0) {
      this->timerfdIsArmed = false;
    }
    else {
      t2.value = (long)this_00;
      local_d0 = origin<kj::Absolute<kj::Quantity<long,kj::_::NanosecondLabel>,kj::_::TimeLabel>>();
      local_c8 = Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel>::operator-
                           (this_00,&local_d0);
      ts.it_interval.tv_nsec =
           Quantity<long,kj::_::NanosecondLabel>::operator/
                     ((Quantity<long,kj::_::NanosecondLabel> *)&local_c8,
                      (Quantity<long,_kj::_::NanosecondLabel> *)&SECONDS);
      QStack_d8 = Quantity<long,_kj::_::NanosecondLabel>::operator%<long>
                            (&local_c8,(Quantity<long,_kj::_::NanosecondLabel> *)&SECONDS);
      ts.it_value.tv_sec =
           Quantity<long,kj::_::NanosecondLabel>::operator/
                     ((Quantity<long,kj::_::NanosecondLabel> *)&stack0xffffffffffffff28,
                      (Quantity<long,_kj::_::NanosecondLabel> *)&NANOSECONDS);
      this->timerfdIsArmed = true;
    }
    f_3.exception = (Exception *)&_f777;
    local_dc = kj::_::Debug::
               syscall<kj::UnixEventPort::updateNextTimerEvent(kj::Maybe<kj::Absolute<kj::Quantity<long,kj::_::NanosecondLabel>,kj::_::TimeLabel>>)::__2>
                         ((anon_class_16_2_c96500c4 *)&f_3,false);
    pvVar4 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_dc);
    if (pvVar4 == (void *)0x0) {
      iVar2 = kj::_::Debug::SyscallResult::getErrorNumber(&local_dc);
      kj::_::Debug::Fault::Fault
                (&local_f8,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
                 ,0x323,iVar2,"timerfd_settime(tfd, TFD_TIMER_ABSTIME, &ts, nullptr)","");
      kj::_::Debug::Fault::fatal(&local_f8);
    }
  }
  return;
}

Assistant:

void UnixEventPort::updateNextTimerEvent(kj::Maybe<TimePoint> time) {
  if (time == kj::none && !timerfdIsArmed) {
    // No change needed.
    return;
  }

  // Create the timerfd if needed.
  int tfd;
  KJ_IF_SOME(f, timerFd) {
    tfd = f;
  } else {
    tfd = timerFd.emplace(
        KJ_SYSCALL_FD(timerfd_create(CLOCK_MONOTONIC, TFD_CLOEXEC | TFD_NONBLOCK)));

    struct epoll_event event;
    memset(&event, 0, sizeof(event));
    event.events = EPOLLIN;
    event.data.u64 = 1;
    KJ_SYSCALL(epoll_ctl(epollFd, EPOLL_CTL_ADD, tfd, &event));
  }